

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O0

be_node * makeCompactPeerIds(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *values)

{
  bool bVar1;
  int len;
  char *str;
  be_node *node;
  be_node *val1;
  _List_node_base *local_28;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator it;
  be_node *valuesnode;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values_local;
  
  it._M_node = (_List_node_base *)be_create_list();
  std::
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  _List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(values);
  local_20._M_node = local_28;
  while( true ) {
    val1 = (be_node *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(values);
    bVar1 = std::operator!=(&local_20,(_Self *)&val1);
    if (!bVar1) break;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->(&local_20);
    str = (char *)std::__cxx11::string::c_str();
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->(&local_20);
    len = std::__cxx11::string::length();
    node = be_create_str_wlen(str,len);
    be_add_list((be_node *)it._M_node,node);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20,0);
  }
  return (be_node *)it._M_node;
}

Assistant:

be_node *makeCompactPeerIds(std::list<std::string> &values) {
        be_node *valuesnode = be_create_list();
	std::list<std::string>::iterator it;
	for (it = values.begin(); it != values.end(); it++) {
        	be_node *val1 = be_create_str_wlen((char *) it->c_str(), it->length());
		be_add_list(valuesnode, val1);
	}
	return valuesnode;
}